

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILPSolver.cpp
# Opt level: O0

void __thiscall CILPSolver::PrepareSolutionBuffer(CILPSolver *this,int iNumSolution)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  double *pdVar3;
  int iNumSolution_local;
  CILPSolver *this_local;
  
  if (this->m_iNumSolution < iNumSolution) {
    if (this->m_pSolution != (double *)0x0) {
      if (this->m_pSolution != (double *)0x0) {
        operator_delete__(this->m_pSolution);
      }
      this->m_pSolution = (double *)0x0;
    }
    this->m_iNumSolution = iNumSolution;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)(this->m_iNumSolution + 1);
    uVar2 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    pdVar3 = (double *)operator_new__(uVar2);
    this->m_pSolution = pdVar3;
    if (this->m_pSolution == (double *)0x0) {
      __assert_fail("m_pSolution",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/ILPSolver.cpp"
                    ,0x1e1,"void CILPSolver::PrepareSolutionBuffer(int)");
    }
  }
  return;
}

Assistant:

void CILPSolver::PrepareSolutionBuffer(int iNumSolution)
{
	if(iNumSolution>m_iNumSolution)
	{
#define SAFE_DELA(p)				{if(p) {delete[] p; p=NULL;}}
		SAFE_DELA(m_pSolution);

		m_iNumSolution	=	iNumSolution;
		m_pSolution		=	new	double[m_iNumSolution+1];

		assert(m_pSolution);

#ifdef _DEBUG
		m_pSolution[0]					=	-99;
		m_pSolution[m_iNumSolution]		=	-99;
#endif
	}
}